

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen_status yajl_gen_string(yajl_gen g,uchar *str,size_t len)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  yajl_gen_state yVar5;
  uint _i;
  uint uVar6;
  char *pcVar7;
  
  if (((g->flags & 8) != 0) && (iVar3 = yajl_string_validate_utf8(str,len), iVar3 == 0)) {
    return yajl_gen_invalid_string;
  }
  switch(g->state[g->depth]) {
  case yajl_gen_map_key:
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) != 0) {
      pcVar7 = "\n";
LAB_00105229:
      (*g->print)(g->ctx,pcVar7,1);
    }
    break;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) != 0) {
      pcVar7 = " ";
      goto LAB_00105229;
    }
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  if (((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val && (ulong)g->depth != 0)) {
    uVar6 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar7 = g->indentString;
      sVar4 = strlen(pcVar7);
      (*p_Var1)(pvVar2,pcVar7,sVar4 & 0xffffffff);
      uVar6 = uVar6 + 1;
    } while (uVar6 < g->depth);
  }
  (*g->print)(g->ctx,"\"",1);
  yajl_string_encode(g->print,g->ctx,str,len,g->flags & 0x10);
  (*g->print)(g->ctx,"\"",1);
  uVar6 = g->depth;
  yVar5 = g->state[uVar6];
  switch(yVar5) {
  case yajl_gen_start:
    g->state[uVar6] = yajl_gen_complete;
    if ((g->flags & 1) == 0) {
      return yajl_gen_status_ok;
    }
    goto LAB_00105330;
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    yVar5 = yajl_gen_map_val;
    break;
  case yajl_gen_map_val:
    yVar5 = yajl_gen_map_key;
    break;
  case yajl_gen_array_start:
    yVar5 = yajl_gen_in_array;
    break;
  default:
    goto switchD_001052ec_default;
  }
  g->state[uVar6] = yVar5;
switchD_001052ec_default:
  if (((g->flags & 1) != 0) && (yVar5 == yajl_gen_complete)) {
LAB_00105330:
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_string(yajl_gen g, const unsigned char * str,
                size_t len)
{
    // if validation is enabled, check that the string is valid utf8
    // XXX: This checking could be done a little faster, in the same pass as
    // the string encoding
    if (g->flags & yajl_gen_validate_utf8) {
        if (!yajl_string_validate_utf8(str, len)) {
            return yajl_gen_invalid_string;
        }
    }
    ENSURE_VALID_STATE; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "\"", 1);
    yajl_string_encode(g->print, g->ctx, str, len, g->flags & yajl_gen_escape_solidus);
    g->print(g->ctx, "\"", 1);
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}